

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_gui.cpp
# Opt level: O2

void QtGuiTest::setKeyboardModifiers(KeyboardModifiers modifiers)

{
  QInputDeviceManager *this;
  QDebug *pQVar1;
  long in_FS_OFFSET;
  QDebug local_40;
  QDebug local_38;
  undefined1 local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QInputDeviceManager *)inputDeviceManager();
  if (this != (QInputDeviceManager *)0x0) {
    QInputDeviceManager::setKeyboardModifiers(this,modifiers);
    lcQtGuiTest();
    if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      QMessageLogger::debug();
      pQVar1 = QDebug::operator<<(&local_40,"Keyboard modifiers synthesized:");
      local_38.stream = pQVar1->stream;
      (local_38.stream)->ref = (local_38.stream)->ref + 1;
      operator<<<QFlags<Qt::KeyboardModifier>,_true>
                ((Stream *)local_30,(QFlagsStorageHelper<Qt::KeyboardModifier,_4>)SUB84(&local_38,0)
                );
      QDebug::~QDebug((QDebug *)local_30);
      QDebug::~QDebug(&local_38);
      QDebug::~QDebug(&local_40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QtGuiTest::setKeyboardModifiers(Qt::KeyboardModifiers modifiers)
{
    auto *idm = inputDeviceManager();
    if (Q_UNLIKELY(!idm))
        return;

    idm->setKeyboardModifiers(modifiers);
    deb << "Keyboard modifiers synthesized:" << modifiers;
}